

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O3

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  byte bVar2;
  int *piVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  curlfiletype cVar7;
  int iVar8;
  CURLcode CVar9;
  curl_fileinfo *pcVar10;
  char *pcVar11;
  int *piVar12;
  void *pvVar13;
  long lVar14;
  ushort **ppuVar15;
  size_t __n;
  ulong uVar16;
  byte *pbVar17;
  ftp_parselist_data *parser;
  ulong uVar18;
  ulong uVar19;
  char *p;
  char *local_38;
  
  uVar16 = size * nmemb;
  piVar3 = (int *)**(undefined8 **)(*connptr + 0x8a80);
  if (piVar3[3] == 0) {
    if ((uVar16 == 0) || (*piVar3 != 0)) {
      if (uVar16 == 0) {
        return 0;
      }
    }
    else {
      *piVar3 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    uVar18 = 0;
    do {
      bVar2 = buffer[uVar18];
      pcVar10 = *(curl_fileinfo **)(piVar3 + 4);
      if (pcVar10 == (curl_fileinfo *)0x0) {
        pcVar10 = Curl_fileinfo_alloc();
        *(curl_fileinfo **)(piVar3 + 4) = pcVar10;
        if (pcVar10 == (curl_fileinfo *)0x0) {
          piVar3[3] = 0x1b;
          return uVar16;
        }
        pcVar11 = (char *)(*Curl_cmalloc)(0xa0);
        pcVar10 = *(curl_fileinfo **)(piVar3 + 4);
        pcVar10->b_data = pcVar11;
        if (pcVar11 == (char *)0x0) {
          lVar14 = **(long **)(*connptr + 0x8a80);
          if (*(void **)(lVar14 + 0x10) != (void *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar14 + 0x10));
          }
          *(undefined8 *)(lVar14 + 0x10) = 0;
          *(undefined4 *)(lVar14 + 0xc) = 0x1b;
          return uVar16;
        }
        pcVar10->b_size = 0xa0;
        piVar3[8] = 0;
        piVar3[9] = 0;
        piVar3[6] = 0;
      }
      else {
        pcVar11 = pcVar10->b_data;
      }
      sVar4 = pcVar10->b_used;
      pcVar10->b_used = sVar4 + 1;
      pcVar11[sVar4] = bVar2;
      if (pcVar10->b_size - 1 <= pcVar10->b_used) {
        pcVar11 = (char *)(*Curl_crealloc)(pcVar10->b_data,pcVar10->b_size + 0xa0);
        if (pcVar11 == (char *)0x0) {
          Curl_fileinfo_dtor((void *)0x0,*(void **)(piVar3 + 4));
          piVar3[4] = 0;
          piVar3[5] = 0;
          piVar3[3] = 0x1b;
          lVar14 = **(long **)(*connptr + 0x8a80);
          if (*(void **)(lVar14 + 0x10) != (void *)0x0) {
            Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar14 + 0x10));
          }
          *(undefined8 *)(lVar14 + 0x10) = 0;
          *(undefined4 *)(lVar14 + 0xc) = 0x1b;
          return uVar16;
        }
        pcVar10->b_size = pcVar10->b_size + 0xa0;
        pcVar10->b_data = pcVar11;
      }
      uVar19 = (ulong)bVar2;
      if (*piVar3 == 2) {
        switch(piVar3[1]) {
        case 0:
          uVar6 = piVar3[6] + 1;
          piVar3[6] = uVar6;
          if (uVar6 < 9) {
            __n = 0xc;
            pcVar11 = "0123456789-";
LAB_001270cd:
            pvVar13 = memchr(pcVar11,(int)(char)bVar2,__n);
            if (pvVar13 == (void *)0x0) goto LAB_001276d6;
          }
          else {
            if (uVar6 != 9) {
LAB_00127711:
              lVar14 = **(long **)(*connptr + 0x8a80);
              if (*(void **)(lVar14 + 0x10) != (void *)0x0) {
                Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar14 + 0x10));
              }
              *(undefined8 *)(lVar14 + 0x10) = 0;
              *(undefined4 *)(lVar14 + 0xc) = 0x57;
              return uVar16;
            }
            if (bVar2 != 0x20) goto LAB_001276d6;
            piVar3[1] = 1;
            piVar3[2] = 0;
          }
          break;
        case 1:
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (piVar3[2] == 1) {
            if (bVar2 == 0x20) {
              *(long *)(piVar3 + 0x10) = *(long *)(piVar3 + 8);
              pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              piVar3[1] = 2;
              piVar3[2] = 0;
              goto LAB_0012702f;
            }
            __n = 0xf;
            pcVar11 = "APM0123456789:";
            goto LAB_001270cd;
          }
          if ((piVar3[2] != 0) ||
             (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + uVar19 * 2 + 1) & 0x20) != 0)
             ) break;
          goto LAB_00127473;
        case 2:
          iVar8 = piVar3[2];
          if (iVar8 != 1) goto LAB_00126fd5;
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            pcVar11 = pcVar10->b_data;
            lVar14 = *(long *)(piVar3 + 8);
            iVar8 = strcmp("<DIR>",pcVar11 + lVar14);
            if (iVar8 == 0) {
              pcVar10->filetype = CURLFILETYPE_DIRECTORY;
              pcVar10->size = 0;
              lVar14 = *(long *)(piVar3 + 4);
            }
            else {
              lVar14 = strtol(pcVar11 + lVar14,&local_38,10);
              pcVar10->size = lVar14;
              if ((*local_38 != '\0') ||
                 ((lVar14 + 0x8000000000000001U < 2 &&
                  (piVar12 = __errno_location(), *piVar12 == 0x22)))) goto LAB_001276d6;
              lVar14 = *(long *)(piVar3 + 4);
              *(undefined4 *)(lVar14 + 8) = 0;
            }
            *(byte *)(lVar14 + 0x60) = *(byte *)(lVar14 + 0x60) | 0x40;
            goto LAB_001273a2;
          }
          break;
        case 3:
          iVar8 = piVar3[2];
          if (iVar8 == 2) {
            if (bVar2 != 10) goto LAB_00127711;
          }
          else {
            if (iVar8 != 1) goto LAB_00126fd5;
            piVar3[6] = piVar3[6] + 1;
            if (bVar2 != 10) {
              if (bVar2 == 0xd) {
                piVar3[2] = 2;
                pcVar10->b_data[pcVar10->b_used - 1] = '\0';
              }
              break;
            }
            pcVar10->b_data[pcVar10->b_used - 1] = '\0';
          }
          *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
          CVar9 = ftp_pl_insert_finfo(*connptr,pcVar10);
          if (CVar9 != CURLE_OK) goto LAB_0012774c;
          piVar3[1] = 0;
          piVar3[2] = 0;
        }
        goto switchD_00126ba4_default;
      }
      if (*piVar3 != 1) {
        return uVar16 + 1;
      }
      switch(piVar3[1]) {
      case 0:
        if (piVar3[2] == 1) {
          uVar6 = piVar3[6];
          piVar3[6] = uVar6 + 1;
          if (bVar2 == 10) {
            pcVar10->b_data[uVar6] = '\0';
            pcVar11 = pcVar10->b_data;
            iVar8 = strncmp("total ",pcVar11,6);
            if (iVar8 != 0) goto LAB_001276d6;
            pbVar17 = (byte *)(pcVar11 + 6);
            ppuVar15 = __ctype_b_loc();
            do {
              bVar2 = *pbVar17;
              pbVar17 = pbVar17 + 1;
            } while ((*(byte *)((long)*ppuVar15 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
            if (bVar2 != 0) goto LAB_001276d6;
            piVar3[1] = 1;
            pcVar10->b_used = 0;
          }
          else if (bVar2 == 0xd) {
            piVar3[6] = uVar6;
            pcVar10->b_used = pcVar10->b_used - 1;
          }
        }
        else if (piVar3[2] == 0) {
          if (bVar2 == 0x74) {
            piVar3[2] = 1;
            piVar3[6] = piVar3[6] + 1;
          }
          else {
            piVar3[1] = 1;
            pcVar10->b_used = 0;
            uVar18 = uVar18 - 1;
          }
        }
        break;
      case 1:
        if (bVar2 < 100) {
          if (bVar2 < 0x62) {
            cVar7 = CURLFILETYPE_FILE;
            if (bVar2 != 0x2d) {
              if (bVar2 != 0x44) goto LAB_001276d6;
              cVar7 = CURLFILETYPE_DOOR;
            }
          }
          else if (bVar2 == 0x62) {
            cVar7 = CURLFILETYPE_DEVICE_BLOCK;
          }
          else {
            if (bVar2 != 99) goto LAB_001276d6;
            cVar7 = CURLFILETYPE_DEVICE_CHAR;
          }
        }
        else if (bVar2 < 0x70) {
          if (bVar2 == 100) {
            cVar7 = CURLFILETYPE_DIRECTORY;
          }
          else {
            if (bVar2 != 0x6c) goto LAB_001276d6;
            cVar7 = CURLFILETYPE_SYMLINK;
          }
        }
        else if (bVar2 == 0x70) {
          cVar7 = CURLFILETYPE_NAMEDPIPE;
        }
        else {
          if (bVar2 != 0x73) goto LAB_001276d6;
          cVar7 = CURLFILETYPE_SOCKET;
        }
        pcVar10->filetype = cVar7;
        piVar3[1] = 2;
        piVar3[6] = 0;
        piVar3[8] = 1;
        piVar3[9] = 0;
        break;
      case 2:
        uVar6 = piVar3[6] + 1;
        piVar3[6] = uVar6;
        if (uVar6 < 10) {
          __n = 9;
          pcVar11 = "rwx-tTsS";
          goto LAB_001270cd;
        }
        if (uVar6 == 10) {
          if (bVar2 != 0x20) goto LAB_00127711;
          pcVar10->b_data[10] = '\0';
          lVar14 = *(long *)(piVar3 + 8);
          uVar6 = ftp_pl_get_permission(pcVar10->b_data + lVar14);
          if (0xffffff < uVar6) goto LAB_001276d6;
          lVar5 = *(long *)(piVar3 + 4);
          puVar1 = (uint *)(lVar5 + 0x60);
          *puVar1 = *puVar1 | 8;
          *(uint *)(lVar5 + 0x18) = uVar6;
          *(long *)(piVar3 + 0x12) = lVar14;
LAB_001273a2:
          piVar3[6] = 0;
          piVar3[1] = 3;
          piVar3[2] = 0;
        }
        break;
      case 3:
        iVar8 = piVar3[2];
        if (iVar8 == 1) {
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            lVar14 = strtol(pcVar10->b_data + *(long *)(piVar3 + 8),&local_38,10);
            if ((*local_38 == '\0') && (lVar14 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
              lVar5 = *(long *)(piVar3 + 4);
              puVar1 = (uint *)(lVar5 + 0x60);
              *puVar1 = *puVar1 | 0x80;
              *(long *)(lVar5 + 0x30) = lVar14;
            }
            piVar3[6] = 0;
            piVar3[8] = 0;
            piVar3[9] = 0;
            piVar3[1] = 4;
            piVar3[2] = 0;
          }
          else if ((byte)(bVar2 - 0x3a) < 0xf6) goto LAB_001276d6;
        }
        else {
LAB_00126f9d:
          if ((iVar8 == 0) && (bVar2 != 0x20)) {
            if (9 < (byte)(bVar2 - 0x30)) goto LAB_001276d6;
LAB_00126fe7:
            *(size_t *)(piVar3 + 8) = pcVar10->b_used - 1;
            piVar3[6] = 1;
            piVar3[2] = 1;
          }
        }
        break;
      case 4:
        iVar8 = piVar3[2];
        if (iVar8 == 1) {
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0xc) = *(undefined8 *)(piVar3 + 8);
            piVar3[1] = 5;
            piVar3[2] = 0;
LAB_00126f81:
            piVar3[8] = 0;
            piVar3[9] = 0;
LAB_0012702f:
            piVar3[6] = 0;
          }
        }
        else {
LAB_00126fd5:
          if (iVar8 == 0) goto switchD_00126ddc_caseD_0;
        }
        break;
      case 5:
        iVar8 = piVar3[2];
        if (iVar8 != 1) goto LAB_00126fd5;
        iVar8 = piVar3[6];
        piVar3[6] = iVar8 + 1U;
        if (bVar2 == 0x20) {
          pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0xe) = *(undefined8 *)(piVar3 + 8);
          piVar3[1] = 6;
          piVar3[2] = 0;
          goto LAB_00126f81;
        }
        break;
      case 6:
        iVar8 = piVar3[2];
        if (iVar8 != 1) goto LAB_00126f9d;
        iVar8 = piVar3[6];
        piVar3[6] = iVar8 + 1U;
        if (bVar2 == 0x20) {
          pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          lVar14 = strtol(pcVar10->b_data + *(long *)(piVar3 + 8),&local_38,10);
          if ((*local_38 == '\0') && (lVar14 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
            lVar5 = *(long *)(piVar3 + 4);
            puVar1 = (uint *)(lVar5 + 0x60);
            *puVar1 = *puVar1 | 0x40;
            *(long *)(lVar5 + 0x28) = lVar14;
          }
          piVar3[6] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          piVar3[1] = 7;
          piVar3[2] = 0;
        }
        else {
          ppuVar15 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar15 + uVar19 * 2 + 1) & 8) == 0) goto LAB_001276d6;
        }
        break;
      case 7:
        switch(piVar3[2]) {
        case 0:
          if (bVar2 != 0x20) {
            ppuVar15 = __ctype_b_loc();
            if (((*ppuVar15)[uVar19] & 8) == 0) goto LAB_001276d6;
            goto LAB_00126fe7;
          }
          break;
        case 1:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 == 0x20) {
LAB_00127312:
            piVar3[2] = 2;
          }
          else {
LAB_00127320:
            ppuVar15 = __ctype_b_loc();
            if ((((*ppuVar15)[uVar19] & 8) == 0) && (bVar2 != 0x2e)) goto LAB_001276d6;
          }
          break;
        case 2:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 != 0x20) {
            ppuVar15 = __ctype_b_loc();
            if (((*ppuVar15)[uVar19] & 8) == 0) goto LAB_001276d6;
LAB_00127446:
            piVar3[2] = 3;
          }
          break;
        case 3:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 != 0x20) goto LAB_00127320;
LAB_00127481:
          piVar3[2] = 4;
          break;
        case 4:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 != 0x20) {
            ppuVar15 = __ctype_b_loc();
            if (((*ppuVar15)[uVar19] & 8) == 0) goto LAB_001276d6;
            piVar3[2] = 5;
          }
          break;
        case 5:
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0x10) = *(undefined8 *)(piVar3 + 8);
            if (pcVar10->filetype == CURLFILETYPE_SYMLINK) {
              piVar3[1] = 9;
              piVar3[2] = 0;
            }
            else {
              piVar3[1] = 8;
              piVar3[2] = 0;
            }
          }
          else {
            ppuVar15 = __ctype_b_loc();
            if (((((*ppuVar15)[uVar19] & 8) == 0) && (bVar2 != 0x2e)) && (bVar2 != 0x3a))
            goto LAB_001276d6;
          }
        }
        break;
      case 8:
        iVar8 = piVar3[2];
        if (iVar8 == 2) {
          if (bVar2 != 10) goto LAB_001276d6;
          pcVar10->b_data[(ulong)(uint)piVar3[6] + *(long *)(piVar3 + 8)] = '\0';
        }
        else {
          if (iVar8 != 1) goto LAB_00126fd5;
          iVar8 = piVar3[6];
          uVar6 = iVar8 + 1;
          piVar3[6] = uVar6;
          if (bVar2 != 10) {
            if (bVar2 == 0xd) {
              piVar3[6] = iVar8;
              goto LAB_00127312;
            }
            break;
          }
          pcVar10->b_data[((ulong)uVar6 - 1) + *(long *)(piVar3 + 8)] = '\0';
        }
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
        piVar3[1] = 1;
        CVar9 = ftp_pl_insert_finfo(*connptr,pcVar10);
        if (CVar9 != CURLE_OK) goto LAB_0012774c;
        break;
      case 9:
        switch(piVar3[2]) {
        case 0:
switchD_00126ddc_caseD_0:
          if (bVar2 != 0x20) goto LAB_00126fe7;
          break;
        case 1:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 == 0x20) goto LAB_00127312;
          if ((bVar2 == 10) || (bVar2 == 0xd)) goto LAB_001276d6;
          break;
        case 2:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 == 0x2d) goto LAB_00127446;
          goto LAB_0012745f;
        case 3:
          piVar3[6] = piVar3[6] + 1;
          if (bVar2 == 0x3e) goto LAB_00127481;
LAB_0012745f:
          if ((bVar2 == 10) || (bVar2 == 0xd)) {
LAB_001276d6:
            lVar14 = **(long **)(*connptr + 0x8a80);
            if (*(void **)(lVar14 + 0x10) != (void *)0x0) {
              Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar14 + 0x10));
            }
            *(undefined8 *)(lVar14 + 0x10) = 0;
            *(undefined4 *)(lVar14 + 0xc) = 0x57;
            return uVar16;
          }
LAB_00127473:
          piVar3[2] = 1;
          break;
        case 4:
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (bVar2 != 0x20) goto LAB_0012745f;
          piVar3[2] = 5;
          pcVar10->b_data[((ulong)(iVar8 + 1U) - 4) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
          piVar3[6] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          break;
        case 5:
          if ((bVar2 == 10) || (bVar2 == 0xd)) goto LAB_001276d6;
          piVar3[2] = 6;
          *(size_t *)(piVar3 + 8) = pcVar10->b_used - 1;
          piVar3[6] = 1;
          break;
        case 6:
          iVar8 = piVar3[6];
          uVar6 = iVar8 + 1;
          piVar3[6] = uVar6;
          if (bVar2 == 10) {
            pcVar11 = pcVar10->b_data;
            goto LAB_001275d2;
          }
          if (bVar2 == 0xd) {
            piVar3[6] = iVar8;
            piVar3[2] = 7;
          }
          break;
        case 7:
          if (bVar2 != 10) goto LAB_00127711;
          pcVar11 = pcVar10->b_data;
          uVar6 = piVar3[6];
LAB_001275d2:
          pcVar11[((ulong)uVar6 - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0x14) = *(undefined8 *)(piVar3 + 8);
          CVar9 = ftp_pl_insert_finfo(*connptr,pcVar10);
          if (CVar9 != CURLE_OK) {
LAB_0012774c:
            lVar14 = **(long **)(*connptr + 0x8a80);
            if (*(void **)(lVar14 + 0x10) != (void *)0x0) {
              Curl_fileinfo_dtor((void *)0x0,*(void **)(lVar14 + 0x10));
            }
            *(undefined8 *)(lVar14 + 0x10) = 0;
            *(CURLcode *)(lVar14 + 0xc) = CVar9;
            return uVar16;
          }
          piVar3[1] = 1;
        }
      }
switchD_00126ba4_default:
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar16);
  }
  return uVar16;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct connectdata *conn = (struct connectdata *)connptr;
  struct ftp_wc_tmpdata *tmpdata = conn->data->wildcard.tmp;
  struct ftp_parselist_data *parser = tmpdata->parser;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode rc;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    return bufflen;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        return bufflen;
      }
      parser->file_data->b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->b_data) {
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
      parser->file_data->b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    finfo = parser->file_data;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_dtor(NULL, parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
    }

    switch (parser->os_type) {
    case OS_TYPE_UNIX:
      switch (parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            i--;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data+6;
              /* here we can deal with directory size */
              while(ISSPACE(*endptr))
                endptr++;
              if(*endptr != 0) {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              else {
                parser->state.UNIX.main = PL_UNIX_FILETYPE;
                finfo->b_used = 0;
              }
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch (c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          parser->file_data->flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            fsize = curlx_strtoofft(finfo->b_data+parser->item_offset, &p, 10);
            if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                               fsize != CURL_OFF_T_MIN) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_SIZE;
              parser->file_data->size = fsize;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_TIME;
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
          }
          else if(!ISDIGIT(c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
            }
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length ++;
          if(c == '\r') {
            parser->item_length --;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else {
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISSPACE(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c == ' ') {

          }
          else {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              finfo->size = curlx_strtoofft(finfo->b_data +
                                            parser->item_offset,
                                            &endptr, 10);
              if(!*endptr) {
                if(finfo->size == CURL_OFF_T_MAX ||
                   finfo->size == CURL_OFF_T_MIN) {
                  if(errno == ERANGE) {
                    PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                    return bufflen;
                  }
                }
              }
              else {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              /* correct file type */
              parser->file_data->filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch (parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    default:
      return bufflen+1;
    }

    i++;
  }

  return bufflen;
}